

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O1

void __thiscall
Assimp::LWO::AnimResolver::ExtractAnimChannel(AnimResolver *this,aiNodeAnim **out,uint flags)

{
  undefined8 *puVar1;
  float *pfVar2;
  Envelope *pEVar3;
  pointer paVar4;
  pointer paVar5;
  aiNodeAnim *paVar6;
  aiVectorKey *paVar7;
  aiQuatKey *paVar8;
  ulong uVar9;
  uint uVar10;
  aiQuatKey *paVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> local_98;
  undefined1 local_78 [16];
  pointer local_68;
  undefined4 local_5c;
  undefined1 local_58 [16];
  float local_48;
  
  *out = (aiNodeAnim *)0x0;
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next != (_List_node_base *)this->envelopes) {
    pEVar3 = this->trans_x;
    if (((pEVar3 == (Envelope *)0x0) ||
        (bVar15 = true,
        (ulong)(((long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2))
       && ((pEVar3 = this->trans_y, pEVar3 == (Envelope *)0x0 ||
           (bVar15 = true,
           (ulong)(((long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)
           ))) {
      pEVar3 = this->trans_z;
      if (pEVar3 == (Envelope *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = 1 < (ulong)(((long)(pEVar3->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pEVar3->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333);
      }
    }
    pEVar3 = this->rotat_x;
    if (((pEVar3 == (Envelope *)0x0) ||
        (bVar16 = true,
        (ulong)(((long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2))
       && ((pEVar3 = this->rotat_y, pEVar3 == (Envelope *)0x0 ||
           (bVar16 = true,
           (ulong)(((long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)
           ))) {
      pEVar3 = this->rotat_z;
      if (pEVar3 == (Envelope *)0x0) {
        bVar16 = false;
      }
      else {
        bVar16 = 1 < (ulong)(((long)(pEVar3->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pEVar3->keys).
                                    super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333);
      }
    }
    pEVar3 = this->scale_x;
    if (((pEVar3 == (Envelope *)0x0) ||
        (local_5c = (undefined4)CONCAT71((int7)((ulong)pEVar3 >> 8),1),
        (ulong)(((long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pEVar3->keys).
                       super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2))
       && ((pEVar3 = this->scale_y, pEVar3 == (Envelope *)0x0 ||
           (local_5c = (undefined4)CONCAT71((int7)((ulong)pEVar3 >> 8),1),
           (ulong)(((long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pEVar3->keys).
                          super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)
           ))) {
      pEVar3 = this->scale_z;
      if (pEVar3 == (Envelope *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = (undefined4)
                   CONCAT71((int7)((ulong)pEVar3 >> 8),
                            1 < (ulong)(((long)(pEVar3->keys).
                                               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pEVar3->keys).
                                               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x3333333333333333));
      }
    }
    if ((bVar15 || bVar16) || ((char)local_5c != '\0')) {
      paVar6 = (aiNodeAnim *)operator_new(0x438);
      (paVar6->mNodeName).length = 0;
      (paVar6->mNodeName).data[0] = '\0';
      memset((paVar6->mNodeName).data + 1,0x1b,0x3ff);
      paVar6->mRotationKeys = (aiQuatKey *)0x0;
      paVar6->mNumScalingKeys = 0;
      *(undefined8 *)&paVar6->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar6->mPositionKeys + 4) = 0;
      paVar6->mScalingKeys = (aiVectorKey *)0x0;
      paVar6->mPreState = aiAnimBehaviour_DEFAULT;
      paVar6->mPostState = aiAnimBehaviour_DEFAULT;
      *out = paVar6;
      if (this->need_to_setup == true) {
        UpdateAnimRangeSetup(this);
        this->need_to_setup = false;
      }
      if (bVar15) {
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78._0_4_ = flags;
        GetKeys(this,&local_98,this->trans_x,this->trans_y,this->trans_z,flags);
        paVar4 = local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68 = local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        sVar14 = (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar10 = (int)((long)sVar14 >> 3) * -0x55555555;
        paVar6->mNumPositionKeys = uVar10;
        uVar13 = (ulong)uVar10 * 0x18;
        paVar7 = (aiVectorKey *)operator_new__(uVar13);
        if ((ulong)uVar10 != 0) {
          uVar9 = 0;
          do {
            puVar1 = (undefined8 *)((long)&paVar7->mTime + uVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)&(paVar7->mValue).z + uVar9) = 0;
            uVar9 = uVar9 + 0x18;
          } while (uVar13 != uVar9);
        }
        paVar6->mPositionKeys = paVar7;
        if (local_68 != paVar4) {
          memmove(paVar7,paVar4,sVar14);
        }
        if (paVar4 != (pointer)0x0) {
          operator_delete(paVar4,(long)local_98.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)paVar4);
        }
        flags = local_78._0_4_;
      }
      if (bVar16) {
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetKeys(this,&local_98,this->rotat_x,this->rotat_y,this->rotat_z,flags);
        uVar10 = (int)((long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
        paVar6->mNumRotationKeys = uVar10;
        uVar13 = (ulong)uVar10;
        paVar8 = (aiQuatKey *)operator_new__(uVar13 * 0x18);
        if (uVar13 != 0) {
          paVar11 = paVar8;
          do {
            paVar11->mTime = 0.0;
            (paVar11->mValue).w = 1.0;
            (paVar11->mValue).x = 0.0;
            (paVar11->mValue).y = 0.0;
            (paVar11->mValue).z = 0.0;
            paVar11 = paVar11 + 1;
          } while (paVar11 != paVar8 + uVar13);
        }
        paVar6->mRotationKeys = paVar8;
        if (paVar6->mNumRotationKeys != 0) {
          lVar12 = 0;
          uVar13 = 0;
          do {
            paVar8 = paVar6->mRotationKeys;
            *(undefined8 *)((long)&paVar8->mTime + lVar12) =
                 *(undefined8 *)
                  ((long)&(local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                           _M_impl.super__Vector_impl_data._M_start)->mTime + lVar12);
            fVar19 = *(float *)((long)&((local_98.
                                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->mValue).x +
                               lVar12) * 0.5;
            local_78._0_4_ = fVar19;
            fVar19 = sinf(fVar19);
            local_48 = cosf((float)local_78._0_4_);
            local_58 = ZEXT416((uint)(fVar19 * 0.0));
            local_78._0_4_ =
                 *(float *)((long)&((local_98.
                                     super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->mValue).y + lVar12)
                 * 0.5;
            fVar17 = sinf((float)local_78._0_4_);
            fVar18 = cosf((float)local_78._0_4_);
            fVar21 = fVar17 * 0.0;
            fVar22 = -(float)local_58._0_4_ * fVar21;
            local_78 = ZEXT416((uint)(((local_48 * fVar18 - (float)local_58._0_4_ * fVar17) -
                                      fVar19 * fVar21) + fVar22));
            local_68 = (pointer)CONCAT44(local_68._4_4_,
                                         local_48 * fVar17 + (float)local_58._0_4_ * fVar18 +
                                         fVar19 * fVar21 + fVar22);
            fVar20 = local_48 * fVar21;
            local_48 = fVar18 * fVar19 + fVar20 + (float)local_58._0_4_ * fVar17 + fVar22;
            fVar18 = (fVar21 * (float)local_58._0_4_ + fVar20 + (float)local_58._0_4_ * fVar18) -
                     fVar19 * fVar17;
            fVar19 = *(float *)((long)&((local_98.
                                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->mValue).z +
                               lVar12) * 0.5;
            fVar17 = sinf(fVar19);
            local_58._0_4_ = fVar17;
            fVar19 = cosf(fVar19);
            fVar17 = (float)local_58._0_4_ * 0.0;
            pfVar2 = (float *)((long)&(paVar8->mValue).w + lVar12);
            *pfVar2 = (((float)local_78._0_4_ * fVar19 - local_68._0_4_ * fVar17) +
                      -local_48 * fVar17) - fVar18 * (float)local_58._0_4_;
            pfVar2[1] = (local_48 * (float)local_58._0_4_ +
                        fVar19 * local_68._0_4_ + (float)local_78._0_4_ * fVar17) - fVar17 * fVar18;
            pfVar2[2] = (fVar19 * local_48 + (float)local_78._0_4_ * fVar17 + fVar17 * fVar18) -
                        local_68._0_4_ * (float)local_58._0_4_;
            pfVar2[3] = (float)local_78._0_4_ * (float)local_58._0_4_ + fVar18 * fVar19 +
                        local_68._0_4_ * fVar17 + -local_48 * fVar17;
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x18;
          } while (uVar13 < paVar6->mNumRotationKeys);
        }
        if (local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((char)local_5c != '\0') {
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetKeys(this,&local_98,this->scale_x,this->scale_y,this->scale_z,flags);
        paVar5 = local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar4 = local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar14 = (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar9 = ((long)sVar14 >> 3) * -0x5555555555555555;
        paVar6->mNumScalingKeys = (uint)uVar9;
        uVar9 = uVar9 & 0xffffffff;
        uVar13 = uVar9 * 0x18;
        paVar7 = (aiVectorKey *)operator_new__(uVar13);
        if (uVar9 != 0) {
          uVar9 = 0;
          do {
            puVar1 = (undefined8 *)((long)&paVar7->mTime + uVar9);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)&(paVar7->mValue).z + uVar9) = 0;
            uVar9 = uVar9 + 0x18;
          } while (uVar13 != uVar9);
        }
        paVar6->mScalingKeys = paVar7;
        if (paVar5 != paVar4) {
          memmove(paVar7,paVar4,sVar14);
        }
        if (paVar4 != (pointer)0x0) {
          operator_delete(paVar4,(long)local_98.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)paVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void AnimResolver::ExtractAnimChannel(aiNodeAnim** out, unsigned int flags /*= 0*/)
{
    *out = NULL;


    //FIXME: crashes if more than one component is animated at different timings, to be resolved.

    // If we have no envelopes, return NULL
    if (envelopes.empty()) {
        return;
    }

    // We won't spawn an animation channel if we don't have at least one envelope with more than one keyframe defined.
    const bool trans = ((trans_x && trans_x->keys.size() > 1) || (trans_y && trans_y->keys.size() > 1) || (trans_z && trans_z->keys.size() > 1));
    const bool rotat = ((rotat_x && rotat_x->keys.size() > 1) || (rotat_y && rotat_y->keys.size() > 1) || (rotat_z && rotat_z->keys.size() > 1));
    const bool scale = ((scale_x && scale_x->keys.size() > 1) || (scale_y && scale_y->keys.size() > 1) || (scale_z && scale_z->keys.size() > 1));
    if (!trans && !rotat && !scale)
        return;

    // Allocate the output animation
    aiNodeAnim* anim = *out = new aiNodeAnim();

    // Setup default animation setup if necessary
    if (need_to_setup) {
        UpdateAnimRangeSetup();
        need_to_setup = false;
    }

    // copy translation keys
    if (trans) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,trans_x,trans_y,trans_z,flags);

        anim->mPositionKeys = new aiVectorKey[ anim->mNumPositionKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mPositionKeys);
    }

    // copy rotation keys
    if (rotat) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,rotat_x,rotat_y,rotat_z,flags);

        anim->mRotationKeys = new aiQuatKey[ anim->mNumRotationKeys = static_cast<unsigned int>(keys.size()) ];

        // convert heading, pitch, bank to quaternion
        // mValue.x=Heading=Rot(Y), mValue.y=Pitch=Rot(X), mValue.z=Bank=Rot(Z)
        // Lightwave's rotation order is ZXY
        aiVector3D X(1.0,0.0,0.0);
        aiVector3D Y(0.0,1.0,0.0);
        aiVector3D Z(0.0,0.0,1.0);
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            aiQuatKey& qk = anim->mRotationKeys[i];
            qk.mTime  = keys[i].mTime;
            qk.mValue = aiQuaternion(Y,keys[i].mValue.x)*aiQuaternion(X,keys[i].mValue.y)*aiQuaternion(Z,keys[i].mValue.z);
        }
    }

    // copy scaling keys
    if (scale) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,scale_x,scale_y,scale_z,flags);

        anim->mScalingKeys = new aiVectorKey[ anim->mNumScalingKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mScalingKeys);
    }
}